

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int nghttp2_session_is_my_stream_id(nghttp2_session *session,int32_t stream_id)

{
  if (stream_id != 0) {
    return (uint)(session->server != '\0') ^ stream_id & 1U;
  }
  return 0;
}

Assistant:

int nghttp2_session_is_my_stream_id(nghttp2_session *session,
                                    int32_t stream_id) {
  int rem;
  if (stream_id == 0) {
    return 0;
  }
  rem = stream_id & 0x1;
  if (session->server) {
    return rem == 0;
  }
  return rem == 1;
}